

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapRiverMix(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  int iVar2;
  long lVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v;
  int *buf;
  int mc;
  int64_t idx;
  int64_t len;
  int err;
  int local_54;
  long local_40;
  int local_4;
  
  if (*(long *)(in_RDI + 0x40) != 0) {
    local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                        (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
    if (local_4 == 0) {
      cVar1 = *(char *)(in_RDI + 8);
      lVar3 = in_RSI + (long)in_R8D * (long)in_R9D * 4;
      local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x40))
                          (*(undefined8 *)(in_RDI + 0x40),lVar3,in_EDX,in_ECX,in_R8D,in_R9D);
      if (local_4 == 0) {
        for (local_40 = 0; local_40 < (long)in_R8D * (long)in_R9D; local_40 = local_40 + 1) {
          local_54 = *(int *)(in_RSI + local_40 * 4);
          if (((*(int *)(lVar3 + local_40 * 4) == 7) && (local_54 != 0)) &&
             ((cVar1 < '\n' || (iVar2 = isOceanic(local_54), iVar2 == 0)))) {
            if (local_54 == 0xc) {
              local_54 = 0xb;
            }
            else if ((local_54 == 0xe) || (local_54 == 0xf)) {
              local_54 = 0xf;
            }
            else {
              local_54 = 7;
            }
          }
          *(int *)(in_RSI + local_40 * 4) = local_54;
        }
        local_4 = 0;
      }
    }
    return local_4;
  }
  printf("mapRiverMix() requires two parents! Use setupMultiLayer()\n");
  exit(1);
}

Assistant:

int mapRiverMix(const Layer * l, int * out, int x, int z, int w, int h)
{
    if unlikely(l->p2 == NULL)
    {
        printf("mapRiverMix() requires two parents! Use setupMultiLayer()\n");
        exit(1);
    }

    int err = l->p->getMap(l->p, out, x, z, w, h); // biome chain
    if unlikely(err != 0)
        return err;

    int64_t len = w*(int64_t)h;
    int64_t idx;
    int mc = l->mc;
    int *buf = out + len;

    err = l->p2->getMap(l->p2, buf, x, z, w, h); // rivers
    if unlikely(err != 0)
        return err;


    for (idx = 0; idx < len; idx++)
    {
        int v = out[idx];

        if (buf[idx] == river && v != ocean && (mc <= MC_1_6 || !isOceanic(v)))
        {
            if (v == snowy_tundra)
                v = frozen_river;
            else if (v == mushroom_fields || v == mushroom_field_shore)
                v = mushroom_field_shore;
            else
                v = river;
        }

        out[idx] = v;
    }

    return 0;
}